

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmPageTableMgr.cpp
# Opt level: O0

GMM_PAGETABLEPool * __thiscall
GmmLib::GmmPageTableMgr::__AllocateNodePool
          (GmmPageTableMgr *this,uint32_t AddrAlignment,POOL_TYPE Type)

{
  GMM_STATUS GVar1;
  GmmPageTablePool *pGVar2;
  GmmPageTableMgr *local_b8;
  GmmPageTablePool *local_a8;
  undefined1 local_78 [8];
  GMM_DEVICE_ALLOC Alloc;
  GMM_CLIENT ClientType;
  HANDLE PoolHnd;
  GMM_PAGETABLEPool *pTTPool;
  GMM_RESOURCE_INFO *pGmmResInfo;
  GMM_STATUS Status;
  POOL_TYPE Type_local;
  uint32_t AddrAlignment_local;
  GmmPageTableMgr *this_local;
  
  memset(local_78,0,0x30);
  if (this->AuxTTObj != (AuxTable *)0x0) {
    EnterCriticalSection(&this->PoolLock);
  }
  local_78._0_4_ = 0x200000;
  Alloc.Priv = this->hCsr;
  local_78._4_4_ = AddrAlignment;
  GVar1 = __GmmDeviceAlloc(this->pClientContext,&this->DeviceCbInt,(GMM_DEVICE_ALLOC *)local_78);
  if (GVar1 == GMM_SUCCESS) {
    pGVar2 = (GmmPageTablePool *)operator_new(0x58);
    local_a8 = (GmmPageTablePool *)0x0;
    if (pGVar2 != (GmmPageTablePool *)0x0) {
      GmmPageTablePool::GmmPageTablePool
                (pGVar2,(HANDLE)Alloc._0_8_,(GMM_RESOURCE_INFO *)Alloc.CPUVA,
                 (GMM_GFX_ADDRESS)Alloc.Handle,Alloc.GfxVA,Type);
      local_a8 = pGVar2;
    }
    PoolHnd = local_a8;
    if (local_a8 == (GmmPageTablePool *)0x0) {
      pGmmResInfo._4_4_ = 3;
    }
    else {
      if (this->pPool == (GMM_PAGETABLEPool *)0x0) {
        this->NumNodePoolElements = 1;
        this->pPool = local_a8;
      }
      else {
        this->NumNodePoolElements = this->NumNodePoolElements + 1;
        if (Type == POOL_TYPE_TRTTL2) {
          pGVar2 = GmmPageTablePool::InsertInListAtBegin(this->pPool,local_a8);
          this->pPool = pGVar2;
        }
        else {
          PoolHnd = GmmPageTablePool::InsertInList(this->pPool,local_a8);
        }
      }
      pGmmResInfo._4_4_ = 0;
    }
    if (this->AuxTTObj != (AuxTable *)0x0) {
      LeaveCriticalSection(&this->PoolLock);
    }
    if (pGmmResInfo._4_4_ == 0) {
      local_b8 = (GmmPageTableMgr *)PoolHnd;
    }
    else {
      local_b8 = (GmmPageTableMgr *)0x0;
    }
    this_local = local_b8;
  }
  else {
    if (this->AuxTTObj != (AuxTable *)0x0) {
      LeaveCriticalSection(&this->PoolLock);
    }
    this_local = (GmmPageTableMgr *)0x0;
  }
  return (GMM_PAGETABLEPool *)this_local;
}

Assistant:

GmmLib::GMM_PAGETABLEPool *GmmLib::GmmPageTableMgr::__AllocateNodePool(uint32_t AddrAlignment, GmmLib::POOL_TYPE Type)
{
    GMM_STATUS         Status      = GMM_SUCCESS;
    GMM_RESOURCE_INFO *pGmmResInfo = NULL;
    GMM_PAGETABLEPool *pTTPool     = NULL;
    HANDLE             PoolHnd     = 0;
    GMM_CLIENT         ClientType;
    GMM_DEVICE_ALLOC   Alloc = {0};

    ENTER_CRITICAL_SECTION

    //Allocate pool, sized PAGETABLE_POOL_MAX_NODES pages, assignable to TR/Aux L1/L2 tables
    //SVM allocation, always resident
    Alloc.Size      = PAGETABLE_POOL_SIZE;
    Alloc.Alignment = AddrAlignment;
    Alloc.hCsr      = hCsr;

    Status = __GmmDeviceAlloc(pClientContext, &DeviceCbInt, &Alloc);

    if(Status != GMM_SUCCESS)
    {
        __GMM_ASSERT(0);
        EXIT_CRITICAL_SECTION
        return NULL;
    }

    PoolHnd     = Alloc.Handle;
    pGmmResInfo = (GMM_RESOURCE_INFO *)Alloc.Priv;

    pTTPool = new GMM_PAGETABLEPool(PoolHnd, pGmmResInfo, Alloc.GfxVA, Alloc.CPUVA, Type);


    if(pTTPool)
    {
        if(pPool)
        {
            NumNodePoolElements++;
            if(Type == POOL_TYPE_TRTTL2) // TRTT-L2 not 1st node in Pool LinkedList, place it at beginning
            {
                pPool = pPool->InsertInListAtBegin(pTTPool);
            }
            else
            {
                pTTPool = pPool->InsertInList(pTTPool);
            }
        }
        else
        {
            NumNodePoolElements = 1;
            pPool               = pTTPool;
        }
    }
    else
    {
        __GMM_ASSERT(0);
        Status = GMM_OUT_OF_MEMORY;
    }

    EXIT_CRITICAL_SECTION
    return (Status == GMM_SUCCESS) ? pTTPool : NULL;
}